

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O2

void mbedtls_mpi_swap(mbedtls_mpi *X,mbedtls_mpi *Y)

{
  mbedtls_mpi_uint *pmVar1;
  size_t sVar2;
  size_t sVar3;
  undefined4 uVar4;
  int iVar5;
  undefined4 uVar6;
  mbedtls_mpi T;
  
  pmVar1 = X->p;
  iVar5 = X->s;
  uVar6 = *(undefined4 *)&X->field_0x4;
  sVar2 = X->n;
  X->p = Y->p;
  uVar4 = *(undefined4 *)&Y->field_0x4;
  sVar3 = Y->n;
  X->s = Y->s;
  *(undefined4 *)&X->field_0x4 = uVar4;
  X->n = sVar3;
  Y->p = pmVar1;
  Y->s = iVar5;
  *(undefined4 *)&Y->field_0x4 = uVar6;
  Y->n = sVar2;
  return;
}

Assistant:

void mbedtls_mpi_swap( mbedtls_mpi *X, mbedtls_mpi *Y )
{
    mbedtls_mpi T;
    MPI_VALIDATE( X != NULL );
    MPI_VALIDATE( Y != NULL );

    memcpy( &T,  X, sizeof( mbedtls_mpi ) );
    memcpy(  X,  Y, sizeof( mbedtls_mpi ) );
    memcpy(  Y, &T, sizeof( mbedtls_mpi ) );
}